

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void __thiscall
Imf_2_5::Header::Header
          (Header *this,int width,int height,float pixelAspectRatio,V2f *screenWindowCenter,
          float screenWindowWidth,LineOrder lineOrder,Compression compression)

{
  _Rb_tree_header *p_Var1;
  Box2i displayWindow;
  Box2i local_40;
  
  p_Var1 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->_map)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  anon_unknown_1::sanityCheckDisplayWindow(width,height);
  staticInitialize();
  local_40.max.x = width + -1;
  local_40.max.y = height + -1;
  local_40.min.x = 0;
  local_40.min.y = 0;
  anon_unknown_1::initialize
            (this,&local_40,&local_40,pixelAspectRatio,screenWindowCenter,screenWindowWidth,
             lineOrder,compression);
  return;
}

Assistant:

Header::Header (int width,
		int height,
		float pixelAspectRatio,
		const V2f &screenWindowCenter,
		float screenWindowWidth,
		LineOrder lineOrder,
		Compression compression)
:
    _map()
{
    sanityCheckDisplayWindow (width, height);

    staticInitialize();

    Box2i displayWindow (V2i (0, 0), V2i (width - 1, height - 1));

    initialize (*this,
		displayWindow,
		displayWindow,
		pixelAspectRatio,
		screenWindowCenter,
		screenWindowWidth,
		lineOrder,
		compression);
}